

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ISingleStringReader.h
# Opt level: O0

void __thiscall
ISingleStringReader::ISingleStringReader
          (ISingleStringReader *this,ifstream *ifs,ostream *os,int deep,string *str,string *dataType
          )

{
  string *dataType_local;
  string *str_local;
  int deep_local;
  ostream *os_local;
  ifstream *ifs_local;
  ISingleStringReader *this_local;
  
  IAbstractReader::IAbstractReader(&this->super_IAbstractReader,ifs,os,deep,false);
  (this->super_IAbstractReader)._vptr_IAbstractReader = (_func_int **)&PTR_getWord_00122c00;
  std::__cxx11::string::string((string *)&this->m_str);
  std::__cxx11::string::operator=
            ((string *)&(this->super_IAbstractReader).m_dataType,(string *)dataType);
  std::__cxx11::string::operator=((string *)&this->m_str,(string *)str);
  return;
}

Assistant:

explicit ISingleStringReader (std::ifstream* ifs, std::ostream* os, int deep,std::string str,std::string dataType="Keyword"): IAbstractReader(ifs, os, deep) {
        m_dataType = dataType;
        m_str = str;
    }